

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilDsd.c
# Opt level: O0

Hsh_IntMan_t * Sdm_ManBuildHashTable(Vec_Int_t **pvConfgRes)

{
  int iVar1;
  Vec_Wrd_t *p;
  Vec_Int_t *p_00;
  FILE *__stream;
  word *__ptr;
  int *__ptr_00;
  Hsh_IntMan_t *pHVar2;
  Hsh_IntMan_t *pHash;
  Vec_Int_t *vConfgRes;
  Vec_Wrd_t *vTruthRes;
  int size;
  int RetValue;
  char *pFileName;
  FILE *pFile;
  Vec_Int_t **pvConfgRes_local;
  
  iVar1 = Extra_FileSize("dsdfuncs6.dat");
  iVar1 = iVar1 / 0xc;
  p = Vec_WrdAlloc(iVar1);
  p_00 = Vec_IntAlloc(iVar1);
  __stream = fopen("dsdfuncs6.dat","rb");
  __ptr = Vec_WrdArray(p);
  fread(__ptr,8,(long)iVar1,__stream);
  __ptr_00 = Vec_IntArray(p_00);
  fread(__ptr_00,4,(long)iVar1,__stream);
  p->nSize = iVar1;
  p_00->nSize = iVar1;
  pHVar2 = Hsh_WrdManHashArrayStart(p,1);
  if (pvConfgRes == (Vec_Int_t **)0x0) {
    Vec_IntFree(p_00);
  }
  else {
    *pvConfgRes = p_00;
  }
  Vec_WrdFree(p);
  return pHVar2;
}

Assistant:

Hsh_IntMan_t * Sdm_ManBuildHashTable( Vec_Int_t ** pvConfgRes ) 
{
    FILE * pFile;
    char * pFileName = "dsdfuncs6.dat";
    int RetValue, size = Extra_FileSize( pFileName ) / 12;  // 2866420
    Vec_Wrd_t * vTruthRes = Vec_WrdAlloc( size );
    Vec_Int_t * vConfgRes = Vec_IntAlloc( size );
    Hsh_IntMan_t * pHash;

    pFile = fopen( pFileName, "rb" );
    RetValue = fread( Vec_WrdArray(vTruthRes), sizeof(word), size, pFile );
    RetValue = fread( Vec_IntArray(vConfgRes), sizeof(int), size, pFile );
    vTruthRes->nSize = size;
    vConfgRes->nSize = size;
    // create hash table
    pHash = Hsh_WrdManHashArrayStart( vTruthRes, 1 );
    // cleanup
    if ( pvConfgRes )
        *pvConfgRes = vConfgRes;
    else
        Vec_IntFree( vConfgRes );
    Vec_WrdFree( vTruthRes );
//    Hsh_IntManStop( pHash );
    return pHash;
}